

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::printError(Parser *this,Token *token,string *text)

{
  ErrorType type;
  char *pcVar1;
  size_t extraout_RDX;
  string_view text_00;
  string *text_local;
  Token *token_local;
  Parser *this_local;
  
  this->errorLine = token->line;
  pcVar1 = (char *)(token->line & 0xffffffff);
  Global.FileInfo.LineNumber = (int)token->line;
  type = std::__cxx11::string::operator_cast_to_basic_string_view((string *)text);
  text_00._M_str = pcVar1;
  text_00._M_len = extraout_RDX;
  Logger::printError((Logger *)0x1,type,text_00);
  this->error = true;
  return;
}

Assistant:

void Parser::printError(const Token &token, const std::string &text)
{
	errorLine = token.line;
	Global.FileInfo.LineNumber = (int) token.line;
	Logger::printError(Logger::Error, text);
	error = true;
}